

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  Script SVar3;
  Script SVar4;
  undefined1 auVar5 [56];
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  pointer pAVar14;
  AddressType AVar15;
  char cVar16;
  bool bVar17;
  int iVar18;
  uint64_t uVar19;
  long lVar20;
  ulong uVar21;
  uint16_t uVar22;
  Script *pSVar23;
  uint32_t *in_stack_fffffffffffff688;
  uint32_t *in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff69c;
  Script *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6ac;
  undefined4 in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b4;
  pointer in_stack_fffffffffffff6b8;
  undefined4 uStack_93c;
  uint32_t txin_size;
  undefined1 auStack_934 [20];
  uint32_t wit_size;
  undefined1 auStack_91c [20];
  vector<unsigned_char,_std::allocator<unsigned_char>_> locking_script_bytes;
  ByteData txid;
  ByteData block_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_8c0;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  Script local_730;
  Script local_6f8;
  Script local_6c0;
  Descriptor desc;
  UtxoData output;
  
  if (utxo == (Utxo *)0x0) {
    return;
  }
  UtxoData::UtxoData(&output,utxo_data);
  memset(utxo,0,0xd8);
  utxo->block_height = utxo_data->block_height;
  utxo->vout = utxo_data->vout;
  utxo->binary_data = utxo_data->binary_data;
  uVar19 = cfd::core::Amount::GetSatoshiValue();
  utxo->amount = uVar19;
  cfd::core::BlockHash::GetData();
  cVar16 = cfd::core::ByteData::Empty();
  if (cVar16 == '\0') {
    cfd::core::ByteData::GetBytes();
    uVar6 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar7 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar11 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar12 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar13 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->block_hash + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->block_hash + 0x18) = p_Var2;
    utxo->block_hash[0] = uVar6;
    utxo->block_hash[1] = uVar7;
    utxo->block_hash[2] = uVar8;
    utxo->block_hash[3] = uVar9;
    utxo->block_hash[4] = uVar10;
    utxo->block_hash[5] = uVar11;
    utxo->block_hash[6] = uVar12;
    utxo->block_hash[7] = uVar13;
    *(undefined8 *)(utxo->block_hash + 8) = uVar1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  }
  cfd::core::Txid::GetData();
  cVar16 = cfd::core::ByteData::Empty();
  if (cVar16 == '\0') {
    cfd::core::ByteData::GetBytes();
    uVar6 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar7 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar11 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar12 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar13 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->txid + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->txid + 0x18) = p_Var2;
    utxo->txid[0] = uVar6;
    utxo->txid[1] = uVar7;
    utxo->txid[2] = uVar8;
    utxo->txid[3] = uVar9;
    utxo->txid[4] = uVar10;
    utxo->txid[5] = uVar11;
    utxo->txid[6] = uVar12;
    utxo->txid[7] = uVar13;
    *(undefined8 *)(utxo->txid + 8) = uVar1;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  }
  locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((utxo_data->descriptor)._M_string_length != 0) {
    cfd::core::GetBitcoinAddressFormatList();
    cVar16 = cfd::core::ConfidentialAssetId::IsEmpty();
    if (cVar16 == '\0') {
      cfd::core::GetElementsAddressFormatList();
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      operator=((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)&wit_size,&elements_prefixes);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&elements_prefixes);
    }
    cfd::core::Address::GetAddress_abi_cxx11_();
    pAVar14 = elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string((string *)&elements_prefixes);
    if (pAVar14 != (pointer)0x0) {
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      clear((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &wit_size);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&elements_prefixes,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&utxo_data->field_0x208);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      emplace_back<cfd::core::AddressFormatData>
                ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&wit_size,(AddressFormatData *)&elements_prefixes);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&elements_prefixes);
    }
    cfd::core::Descriptor::Parse((string *)&desc,(vector *)&utxo_data->descriptor);
    iVar18 = cfd::core::Descriptor::GetNeedArgumentNum();
    if (iVar18 == 0) {
      cfd::core::Descriptor::GetReferenceAll((vector *)&txin_size);
      cfd::core::DescriptorScriptReference::GetLockingScript();
      cfd::core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
      core::Script::~Script((Script *)&elements_prefixes);
      cfd::core::Script::GetData();
      cfd::core::ByteData::GetBytes();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&locking_script_bytes,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_8c0);
      iVar18 = cfd::core::DescriptorScriptReference::GetScriptType();
      if ((iVar18 != 10) ||
         (cVar16 = cfd::core::DescriptorScriptReference::HasAddress(), cVar16 != '\0')) {
        output.address_type = cfd::core::DescriptorScriptReference::GetAddressType();
        cfd::core::DescriptorScriptReference::GenerateAddress((NetType)&elements_prefixes);
        cfd::core::Address::operator=(&output.address,(Address *)&elements_prefixes);
        core::Address::~Address((Address *)&elements_prefixes);
        cVar16 = cfd::core::DescriptorScriptReference::HasRedeemScript();
        if (cVar16 != '\0') {
          cfd::core::DescriptorScriptReference::GetRedeemScript();
          cfd::core::Script::operator=(&output.redeem_script,(Script *)&elements_prefixes);
          core::Script::~Script((Script *)&elements_prefixes);
        }
      }
      utxo->address_type = (undefined2)output.address_type;
      std::
      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                 *)&txin_size);
    }
    core::DescriptorNode::~DescriptorNode((DescriptorNode *)&desc);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &wit_size);
    if (locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_002023de;
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::~string((string *)&elements_prefixes);
  if (elements_prefixes.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
    core::Script::~Script((Script *)&elements_prefixes);
    cfd::core::Script::GetData();
    cfd::core::ByteData::GetBytes();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&locking_script_bytes,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&desc);
    if ((output._196_4_ != 1) || (1 < output.address_type - kP2shP2wshAddress)) {
      output.address_type = output._196_4_;
    }
    utxo->address_type = (uint16_t)output.address_type;
    goto LAB_002023de;
  }
  cVar16 = cfd::core::Script::IsEmpty();
  if (cVar16 != '\0') goto LAB_002023de;
  cfd::core::Script::GetData();
  cfd::core::ByteData::GetBytes();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&locking_script_bytes,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&desc);
  cVar16 = cfd::core::Script::IsP2wpkhScript();
  if (cVar16 == '\0') {
    cVar16 = cfd::core::Script::IsP2wshScript();
    if (cVar16 == '\0') {
      cVar16 = cfd::core::Script::IsP2pkhScript();
      if (cVar16 == '\0') {
        cVar16 = cfd::core::Script::IsTaprootScript();
        if (cVar16 == '\0') {
          cVar16 = cfd::core::Script::IsWitnessProgram();
          if (cVar16 != '\0') {
            cfd::core::Script::GetElementList();
            lVar20 = cfd::core::ScriptElement::GetNumber();
            std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
            ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    &elements_prefixes);
            if (lVar20 != 0) {
              output.address_type = kWitnessUnknown;
              uVar22 = 8;
              goto LAB_002023d2;
            }
          }
          output.address_type = kP2shAddress;
          uVar22 = 1;
        }
        else {
          output.address_type = kTaprootAddress;
          uVar22 = 7;
        }
      }
      else {
        output.address_type = kP2pkhAddress;
        uVar22 = 2;
      }
    }
    else {
      output.address_type = kP2wshAddress;
      uVar22 = 3;
    }
  }
  else {
    output.address_type = kP2wpkhAddress;
    uVar22 = 4;
  }
LAB_002023d2:
  utxo->address_type = uVar22;
LAB_002023de:
  if (locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start !=
      locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    uVar21 = (long)locking_script_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)locking_script_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    utxo->script_length = (uint16_t)uVar21;
    if (((uint)uVar21 & 0xfff8) < 0x28) {
      memcpy(utxo->locking_script,
             locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,uVar21 & 0xffff);
    }
  }
  wit_size._0_2_ = 0;
  wit_size._2_2_ = 0;
  txin_size = 0;
  cVar16 = cfd::core::Script::IsEmpty();
  pSVar23 = &output.scriptsig_template;
  if (cVar16 != '\0') {
    pSVar23 = (Script *)0x0;
  }
  cVar16 = cfd::core::ConfidentialAssetId::IsEmpty();
  if (cVar16 == '\0') {
    cfd::core::ConfidentialAssetId::GetData();
    cfd::core::ByteData::GetBytes();
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&desc);
    utxo->asset[0x20] =
         *(uint8_t *)
          &((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_right;
    uVar6 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
    uVar7 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
    uVar8 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
    uVar9 = ((elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
    uVar10 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
    uVar11 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
    uVar12 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
    uVar13 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
    uVar1 = *(undefined8 *)
             &((elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header
              ._M_header;
    p_Var2 = ((elements_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    *(_Base_ptr *)(utxo->asset + 0x10) =
         ((elements_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
         _M_header._M_parent;
    *(_Base_ptr *)(utxo->asset + 0x18) = p_Var2;
    utxo->asset[0] = uVar6;
    utxo->asset[1] = uVar7;
    utxo->asset[2] = uVar8;
    utxo->asset[3] = uVar9;
    utxo->asset[4] = uVar10;
    utxo->asset[5] = uVar11;
    utxo->asset[6] = uVar12;
    utxo->asset[7] = uVar13;
    *(undefined8 *)(utxo->asset + 8) = uVar1;
    bVar17 = (bool)cfd::core::ConfidentialAssetId::HasBlinding();
    AVar15 = output.address_type;
    utxo->blinded = bVar17;
    cfd::core::Script::Script(&local_6c0,&output.redeem_script);
    cfd::core::Script::Script(&local_6f8);
    in_stack_fffffffffffff690 = &txin_size;
    in_stack_fffffffffffff688 = &wit_size;
    in_stack_fffffffffffff6b8 = (pointer)0x0;
    in_stack_fffffffffffff6a8 = 0;
    in_stack_fffffffffffff6b0 = 0x34;
    in_stack_fffffffffffff698 = 0;
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff690;
    SVar3._vptr_Script = (_func_int **)in_stack_fffffffffffff688;
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff69c;
    SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar23;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff6ac;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x34;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff6b4;
    SVar3.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auVar5._4_4_ = txin_size;
    auVar5._0_4_ = uStack_93c;
    auVar5._8_20_ = auStack_934;
    auVar5._28_2_ = (uint16_t)wit_size;
    auVar5._30_2_ = wit_size._2_2_;
    auVar5._32_20_ = auStack_91c;
    auVar5._52_4_ = 0;
    cfd::core::ConfidentialTxIn::EstimateTxInSize
              (AVar15,SVar3,(uint)&local_6c0,(Script)(auVar5 << 0x20),false,SUB81(&local_6f8,0),
               (uint *)0x0,(uint *)0x0,
               locking_script_bytes.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_,
               (Script *)
               locking_script_bytes.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)locking_script_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
               (int)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (uint *)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
               (uint)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    core::Script::~Script(&local_6f8);
    core::Script::~Script(&local_6c0);
    txin_size = txin_size - 0x29;
    utxo->witness_size_max = (uint16_t)wit_size;
    utxo->uscript_size_max = (uint16_t)txin_size;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elements_prefixes);
    in_stack_fffffffffffff6a0 = pSVar23;
  }
  AVar15 = output.address_type;
  if (txin_size == 0 && CONCAT22(wit_size._2_2_,(uint16_t)wit_size) == 0) {
    wit_size._0_2_ = 0;
    wit_size._2_2_ = 0;
    txin_size = 0;
    cfd::core::Script::Script(&local_730,&output.redeem_script);
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff690;
    SVar4._vptr_Script = (_func_int **)in_stack_fffffffffffff688;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff698;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff69c;
    SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff6a0;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff6a8;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff6ac;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff6b0;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff6b4;
    SVar4.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff6b8;
    cfd::core::TxIn::EstimateTxInSize
              (AVar15,SVar4,(uint *)&local_730,&wit_size,(Script *)&txin_size);
    core::Script::~Script(&local_730);
    txin_size = txin_size - 0x29;
    utxo->witness_size_max = (uint16_t)wit_size;
    utxo->uscript_size_max = (uint16_t)txin_size;
  }
  if (dest != (UtxoData *)0x0) {
    UtxoData::operator=(dest,&output);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&locking_script_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txid);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block_hash);
  UtxoData::~UtxoData(&output);
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}